

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

void __thiscall
QGraphicsWidget::paintWindowFrame
          (QGraphicsWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,QWidget *widget)

{
  ushort uVar1;
  QGraphicsWidgetPrivate *this_00;
  int iVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar8;
  QStyle *pQVar9;
  long in_FS_OFFSET;
  bool bVar10;
  qreal qVar11;
  undefined1 auVar12 [16];
  QPainterPath windowFrameBackground;
  QStyleOptionFrame frameOptions;
  undefined1 local_138 [24];
  QRegion QStack_120;
  QPalettePrivate *local_118;
  double dStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QPalettePrivate *pQStack_d0;
  undefined1 *local_c8;
  QObject *pQStack_c0;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)(*(long *)(this + 0x18) + 0x1b4);
  this_01 = (QGraphicsProxyWidget *)
            QMetaObject::cast((QObject *)&QGraphicsProxyWidget::staticMetaObject);
  if (this_01 == (QGraphicsProxyWidget *)0x0) {
    bVar10 = false;
  }
  else {
    pQVar8 = QGraphicsProxyWidget::widget(this_01);
    bVar10 = pQVar8 != (QWidget *)0x0;
  }
  QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
  local_a8._0_8_ = (QPalettePrivate *)0x0;
  local_a8._8_4_ = Active;
  local_a8._12_4_ = 0;
  cVar3 = QRectF::contains((QRectF *)local_a8);
  if (cVar3 == '\0') {
    this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    windowFrameGeometry((QRectF *)local_a8,this);
    local_108 = (undefined1 *)0x0;
    auVar12._0_8_ =
         (double)((ulong)local_98 & 0x8000000000000000 | 0x3fe0000000000000) + (double)local_98;
    auVar12._8_8_ =
         (double)((ulong)uStack_90 & 0x8000000000000000 | 0x3fe0000000000000) + (double)uStack_90;
    auVar12 = minpd(_DAT_0066f5d0,auVar12);
    auVar12 = maxpd(auVar12,_DAT_0066f5e0);
    uStack_100 = (undefined1 *)CONCAT44((int)auVar12._8_8_ + -1,(int)auVar12._0_8_ + -1);
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
    QStyleOption::operator=((QStyleOption *)local_a8,&option->super_QStyleOption);
    QGraphicsWidgetPrivate::initStyleOptionTitleBar(this_00,(QStyleOptionTitleBar *)local_a8);
    QGraphicsWidgetPrivate::ensureWindowData(this_00);
    uVar5 = (uint)(byte)((this_00->windowData)._M_t.
                         super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>.
                        _M_head_impl)->field_0x20;
    local_a8._8_4_ = ((uVar5 & 1) << 0xd | local_a8._8_4_ & 0xffffdffb) + (uVar5 & 2) * 2;
    local_98 = local_108;
    uStack_90 = uStack_100;
    local_118 = (QPalettePrivate *)0xffffffffffffffff;
    dStack_110 = -NAN;
    windowFrameRect((QRectF *)local_f8,this);
    local_118 = (QPalettePrivate *)local_f8._0_8_;
    dStack_110 = (double)local_f8._8_8_;
    QPainter::translate((QPointF *)painter);
    local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStack_120.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleHintReturnMask::QStyleHintReturnMask((QStyleHintReturnMask *)(local_138 + 0x10));
    pQVar9 = style(this);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))
                      (pQVar9,0x37,(QStyleOptionTitleBar *)local_a8,widget,
                       (QStyleHintReturnMask *)(local_138 + 0x10));
    if (iVar6 == 0) {
      bVar4 = 0;
    }
    else {
      bVar4 = QRegion::isEmpty();
      bVar4 = bVar4 ^ 1;
    }
    pQVar9 = style(this);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x1a,local_a8,widget,0);
    pQVar9 = style(this);
    iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x2c,local_a8,widget);
    if (bVar4 != 0) {
      QPainter::save();
      QPainter::setClipRegion((QRegion *)painter,(ClipOperation)&QStack_120);
    }
    if ((uVar1 & 0x60) == 0) {
      if (bVar10) {
        local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath((QPainterPath *)local_138);
        local_f8._0_8_ = (undefined8)(int)local_108;
        iVar2 = (int)((ulong)local_108 >> 0x20);
        local_f8._8_8_ = (undefined8)iVar2;
        local_e8 = (undefined1 *)(double)(((long)(int)uStack_100 - (long)(int)local_108) + 1);
        puStack_e0 = (undefined1 *)(double)(((long)uStack_100._4_4_ - (long)iVar2) + 1);
        QPainterPath::addRect((QRectF *)local_138);
        QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
        local_e8 = (undefined1 *)((double)local_e8 + -0.5 + -0.5);
        puStack_e0 = (undefined1 *)((double)puStack_e0 + -0.5 + -0.5);
        local_f8._0_8_ = (0.0 - (double)local_118) + 0.5;
        local_f8._8_8_ = (0.0 - dStack_110) + 0.5;
        QPainterPath::addRect((QRectF *)local_138);
        QPalette::QPalette((QPalette *)local_f8,(QPalette *)(*(long *)(this + 0x18) + 0x188));
        QPalette::brush((ColorGroup)(QPalette *)local_f8,Dark);
        QPainter::fillPath((QPainterPath *)painter,(QBrush *)local_138);
        QPalette::~QPalette((QPalette *)local_f8);
        QPainterPath::~QPainterPath((QPainterPath *)local_138);
      }
      else {
        QPalette::QPalette((QPalette *)local_f8,(QPalette *)(*(long *)(this + 0x18) + 0x188));
        QPalette::brush((ColorGroup)(QPalette *)local_f8,Dark);
        QPainter::fillRect((QRect *)painter,(QBrush *)&local_108);
        QPalette::~QPalette((QPalette *)local_f8);
      }
    }
    qVar11 = QGraphicsWidgetPrivate::titleBarHeight(this_00,(QStyleOptionTitleBar *)local_a8);
    iVar2 = (int)qVar11 + local_98._4_4_;
    if (iVar6 == 0) {
      local_98 = (undefined1 *)CONCAT44(local_98._4_4_ + iVar7,local_98._0_4_ + iVar7);
      uStack_90._0_4_ = uStack_90._0_4_ - iVar7;
    }
    uStack_90 = (undefined1 *)CONCAT44(iVar2 + -1,uStack_90._0_4_);
    QPainter::save();
    QApplication::font((QApplication *)local_f8,"QMdiSubWindowTitleBar");
    QPainter::setFont((QFont *)painter);
    QFont::~QFont((QFont *)local_f8);
    pQVar9 = style(this);
    (**(code **)(*(long *)pQVar9 + 200))(pQVar9,5,local_a8,painter,widget);
    QPainter::restore();
    if (bVar4 != 0) {
      QPainter::restore();
    }
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_c0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_f8);
    QStyleOption::operator=((QStyleOption *)local_f8,&option->super_QStyleOption);
    (**(code **)(*(long *)this + 0x98))(this,(QStyleOptionFrame *)local_f8);
    if (iVar6 != 0) {
      local_138._0_8_ = CONCAT44((int)qVar11 + local_108._4_4_,(undefined4)local_108);
      local_138._8_8_ = uStack_100;
      QPainter::setClipRect((QRect *)painter,(ClipOperation)local_138);
    }
    bVar10 = QGraphicsItem::hasFocus((QGraphicsItem *)(this + 0x10));
    local_f8._8_4_ = (uint)bVar10 << 8 | local_f8._8_4_ & 0xfffffeff;
    bVar10 = QGraphicsItem::isActive((QGraphicsItem *)(this + 0x10));
    local_f8._8_4_ = (uint)bVar10 << 0x10 | local_f8._8_4_ & 0xfffeffff;
    local_c8 = (undefined1 *)((ulong)local_c8 & 0xffffffff00000000);
    local_e8 = local_108;
    puStack_e0 = uStack_100;
    pQVar9 = style(this);
    local_b8._0_4_ = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x2c,0,widget);
    local_b8._4_4_ = 1;
    pQVar9 = style(this);
    (**(code **)(*(long *)pQVar9 + 0xb0))(pQVar9,9,(QStyleOption *)local_f8,painter,widget);
    QStyleOption::~QStyleOption((QStyleOption *)local_f8);
    QStyleHintReturnMask::~QStyleHintReturnMask((QStyleHintReturnMask *)(local_138 + 0x10));
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
  else if ((uVar1 & 0x60) == 0 && !bVar10) {
    QPalette::QPalette((QPalette *)local_a8,(QPalette *)(*(long *)(this + 0x18) + 0x188));
    QPalette::brush((ColorGroup)(QPalette *)local_a8,Dark);
    QPainter::fillRect((QRectF *)painter,(QBrush *)&option->exposedRect);
    QPalette::~QPalette((QPalette *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::paintWindowFrame(QPainter *painter, const QStyleOptionGraphicsItem *option,
                                       QWidget *widget)
{
    const bool fillBackground = !testAttribute(Qt::WA_OpaquePaintEvent)
                                && !testAttribute(Qt::WA_NoSystemBackground);
    QGraphicsProxyWidget *proxy = qobject_cast<QGraphicsProxyWidget *>(this);
    const bool embeddedWidgetFillsOwnBackground = proxy && proxy->widget();

    if (rect().contains(option->exposedRect)) {
        if (fillBackground && !embeddedWidgetFillsOwnBackground)
            painter->fillRect(option->exposedRect, palette().window());
        return;
    }

    Q_D(QGraphicsWidget);

    QRect windowFrameRect = QRect(QPoint(), windowFrameGeometry().size().toSize());
    QStyleOptionTitleBar bar;
    bar.QStyleOption::operator=(*option);
    d->initStyleOptionTitleBar(&bar);   // this clear flags in bar.state
    d->ensureWindowData();
    bar.state.setFlag(QStyle::State_MouseOver, d->windowData->buttonMouseOver);
    bar.state.setFlag(QStyle::State_Sunken, d->windowData->buttonSunken);
    bar.rect = windowFrameRect;

    // translate painter to make the style happy
    const QPointF styleOrigin = this->windowFrameRect().topLeft();
    painter->translate(styleOrigin);

#ifdef Q_OS_MAC
    const QSize pixmapSize = windowFrameRect.size();
    if (pixmapSize.width() <= 0 || pixmapSize.height() <= 0)
        return;
    QPainter *realPainter = painter;
    QPixmap pm(pixmapSize);
    painter = new QPainter(&pm);
#endif

    // Fill background
    QStyleHintReturnMask mask;
    bool setMask = style()->styleHint(QStyle::SH_WindowFrame_Mask, &bar, widget, &mask) && !mask.region.isEmpty();
    bool hasBorder = !style()->styleHint(QStyle::SH_TitleBar_NoBorder, &bar, widget);
    int frameWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar, widget);
    if (setMask) {
        painter->save();
        painter->setClipRegion(mask.region, Qt::IntersectClip);
    }
    if (fillBackground) {
        if (embeddedWidgetFillsOwnBackground) {
            // Don't fill the background twice.
            QPainterPath windowFrameBackground;
            windowFrameBackground.addRect(windowFrameRect);
            // Adjust with 0.5 to avoid border artifacts between
            // widget background and frame background.
            windowFrameBackground.addRect(rect().translated(-styleOrigin).adjusted(0.5, 0.5, -0.5, -0.5));
            painter->fillPath(windowFrameBackground, palette().window());
        } else {
            painter->fillRect(windowFrameRect, palette().window());
        }
    }

    // Draw title
    int height = (int)d->titleBarHeight(bar);
    bar.rect.setHeight(height);
    if (hasBorder) // Frame is painted by PE_FrameWindow
        bar.rect.adjust(frameWidth, frameWidth, -frameWidth, 0);

    painter->save();
    painter->setFont(QApplication::font("QMdiSubWindowTitleBar"));
    style()->drawComplexControl(QStyle::CC_TitleBar, &bar, painter, widget);
    painter->restore();
    if (setMask)
        painter->restore();
    // Draw window frame
    QStyleOptionFrame frameOptions;
    frameOptions.QStyleOption::operator=(*option);
    initStyleOption(&frameOptions);
    if (!hasBorder)
        painter->setClipRect(windowFrameRect.adjusted(0, +height, 0, 0), Qt::IntersectClip);
    frameOptions.state.setFlag(QStyle::State_HasFocus, hasFocus());
    bool isActive = isActiveWindow();
    frameOptions.state.setFlag(QStyle::State_Active, isActive);

    frameOptions.palette.setCurrentColorGroup(isActive ? QPalette::Active : QPalette::Normal);
    frameOptions.rect = windowFrameRect;
    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, widget);
    frameOptions.midLineWidth = 1;
    style()->drawPrimitive(QStyle::PE_FrameWindow, &frameOptions, painter, widget);

#ifdef Q_OS_MAC
    realPainter->drawPixmap(QPoint(), pm);
    delete painter;
#endif
}